

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

bool __thiscall PowerPos<0,_0,_0>::propagate_y(PowerPos<0,_0,_0> *this)

{
  bool bVar1;
  int64_t iVar2;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  IntView<0> *this_00;
  double dVar3;
  IntView<0> *this_01;
  Reason m_r_1;
  int64_t m_v_1;
  int64_t y_max_new;
  Reason m_r;
  int64_t m_v;
  int64_t y_min_new;
  double log_res;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  IntView<0> *in_stack_ffffffffffffff60;
  IntView<0> *in_stack_ffffffffffffff68;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffff70;
  Reason *in_stack_ffffffffffffff78;
  double in_stack_ffffffffffffff80;
  Reason local_58;
  anon_union_8_2_743a5d44_for_Reason_0 local_50;
  anon_union_8_2_743a5d44_for_Reason_0 local_48;
  anon_union_8_2_743a5d44_for_Reason_0 local_40;
  int local_38;
  int local_34;
  anon_union_8_2_743a5d44_for_Reason_0 local_30;
  long local_28;
  long local_20;
  double local_18;
  
  iVar2 = IntView<0>::getMin(in_stack_ffffffffffffff60);
  if ((0 < iVar2) && (iVar2 = IntView<0>::getMax(in_stack_ffffffffffffff60), 1 < iVar2)) {
    iVar2 = IntView<0>::getMin(in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff80 = log2((double)iVar2);
    iVar2 = IntView<0>::getMax(in_stack_ffffffffffffff60);
    local_18 = log2((double)iVar2);
    local_18 = in_stack_ffffffffffffff80 / local_18;
    dVar3 = ceil(local_18);
    local_20 = (long)dVar3;
    iVar2 = IntView<0>::getMin(in_stack_ffffffffffffff60);
    if (iVar2 < (long)dVar3) {
      in_stack_ffffffffffffff78 = (Reason *)IntView<0>::getMin(in_stack_ffffffffffffff60);
      iVar2 = IntView<0>::getMax(in_stack_ffffffffffffff60);
      iVar2 = my_pow(iVar2,local_20 + -1);
      if ((long)in_stack_ffffffffffffff78 <= iVar2) {
        local_20 = local_20 + -1;
      }
      local_28 = local_20;
      bVar1 = IntView<0>::setMinNotR
                        (in_stack_ffffffffffffff60,
                         CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      if (bVar1) {
        Reason::Reason((Reason *)&local_30,(Clause *)0x0);
        if ((so.lazy & 1U) != 0) {
          local_34 = (int)IntView<0>::getMinLit
                                    ((IntView<0> *)
                                     CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
          local_38 = (int)IntView<0>::getMaxLit
                                    ((IntView<0> *)
                                     CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
          Reason::Reason(in_stack_ffffffffffffff78,
                         (Lit)(int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                         (Lit)SUB84(in_stack_ffffffffffffff80,0));
        }
        local_40 = local_30;
        bVar1 = IntView<0>::setMin(in_stack_ffffffffffffff68,(int64_t)in_stack_ffffffffffffff60,
                                   (Reason)in_stack_ffffffffffffff70,(bool)in_stack_ffffffffffffff5f
                                  );
        if (!bVar1) {
          return false;
        }
      }
    }
  }
  iVar2 = IntView<0>::getMin(in_stack_ffffffffffffff60);
  if (1 < iVar2) {
    iVar2 = IntView<0>::getMax(in_stack_ffffffffffffff60);
    this_01 = (IntView<0> *)log2((double)iVar2);
    iVar2 = IntView<0>::getMin(in_stack_ffffffffffffff60);
    local_18 = log2((double)iVar2);
    local_18 = (double)this_01 / local_18;
    dVar3 = floor(local_18);
    r._a = (uint64_t)dVar3;
    local_48._a = r._a;
    iVar2 = IntView<0>::getMax(in_stack_ffffffffffffff60);
    if ((long)r._pt < iVar2) {
      this_00 = (IntView<0> *)IntView<0>::getMax(in_stack_ffffffffffffff60);
      iVar2 = IntView<0>::getMin(this_00);
      iVar2 = my_pow(iVar2,local_48._a + 1);
      if ((long)this_00 <= iVar2) {
        local_48._pt = (Clause *)(local_48._a + 1);
      }
      local_50._pt = local_48._pt;
      bVar1 = IntView<0>::setMaxNotR
                        (this_00,CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      if (bVar1) {
        Reason::Reason(&local_58,(Clause *)0x0);
        if ((so.lazy & 1U) != 0) {
          IntView<0>::getMaxLit
                    ((IntView<0> *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
          IntView<0>::getMinLit
                    ((IntView<0> *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
          Reason::Reason(in_stack_ffffffffffffff78,
                         (Lit)(int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                         (Lit)SUB84(in_stack_ffffffffffffff80,0));
        }
        bVar1 = IntView<0>::setMax(this_01,(int64_t)this_00,(Reason)r,
                                   (bool)in_stack_ffffffffffffff5f);
        if (!bVar1) {
          return false;
        }
      }
    }
  }
  return true;
}

Assistant:

bool propagate_y() {
		double log_res;
		// Propagation on the lower bound
		if (z.getMin() > 0 && x.getMax() > 1) {
			log_res = log2(z.getMin()) / log2(x.getMax());
			int64_t y_min_new = static_cast<int64_t>(ceil(log_res));
			if (y_min_new > y.getMin()) {
				// Check for numerical errors and correct them
				if (z.getMin() <= my_pow(x.getMax(), y_min_new - 1)) {
					y_min_new--;
				}
				setDom(y, setMin, y_min_new, z.getMinLit(), x.getMaxLit());
			}
		}
		// Propagation on the upper bound
		if (x.getMin() > 1) {
			log_res = log2(z.getMax()) / log2(x.getMin());
			int64_t y_max_new = static_cast<int64_t>(floor(log_res));
			if (y_max_new < y.getMax()) {
				// Check for numerical errors and correct them
				if (z.getMax() <= my_pow(x.getMin(), y_max_new + 1)) {
					y_max_new++;
				}
				setDom(x, setMax, y_max_new, z.getMaxLit(), x.getMinLit());
			}
		}
		return true;
	}